

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::TextureSpecCase::verifyTexCube
          (TextureSpecCase *this,GLContext *gles2Context,ReferenceContext *refContext)

{
  long *plVar1;
  TestLog *log;
  ContextWrapper *this_00;
  bool bVar2;
  uint uVar3;
  int iVar4;
  undefined8 *puVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int height;
  ulong uVar10;
  CubeFace face;
  int iVar11;
  Surface reference;
  Surface result;
  long *local_260;
  long local_250;
  undefined8 uStack_248;
  uint local_240;
  CompareLogMode local_23c;
  ulong *local_238;
  long local_230;
  ulong local_228 [2];
  ulong *local_218;
  long local_210;
  ulong local_208 [2];
  ulong local_1f8;
  ContextWrapper *local_1f0;
  ReferenceContext *local_1e8;
  GLContext *local_1e0;
  Surface local_1d8;
  Surface local_1c0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_240 = 1;
  if ((this->m_flags & 1) != 0) {
    uVar6 = this->m_width;
    uVar3 = 0x20;
    uVar7 = 0x20;
    if (uVar6 != 0) {
      uVar7 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> uVar7 == 0; uVar7 = uVar7 - 1) {
        }
      }
      uVar7 = uVar7 ^ 0x1f;
    }
    uVar6 = this->m_height;
    if (uVar6 != 0) {
      uVar3 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      uVar3 = uVar3 ^ 0x1f;
    }
    iVar9 = 0x1f - uVar3;
    if ((int)(0x1f - uVar3) < (int)(0x1f - uVar7)) {
      iVar9 = 0x1f - uVar7;
    }
    local_240 = iVar9 + 1;
  }
  if (0 < (int)local_240) {
    local_1f0 = &this->super_ContextWrapper;
    local_1f8 = 0;
    local_1e8 = refContext;
    local_1e0 = gles2Context;
    do {
      iVar4 = this->m_width >> ((byte)local_1f8 & 0x1f);
      iVar9 = 1;
      if (1 < iVar4) {
        iVar9 = iVar4;
      }
      iVar8 = this->m_height >> ((byte)local_1f8 & 0x1f);
      height = 1;
      if (1 < iVar8) {
        height = iVar8;
      }
      local_23c = COMPARE_LOG_ON_ERROR - ((int)local_1f8 == 0);
      bVar2 = true;
      face = CUBEFACE_NEGATIVE_X;
      do {
        tcu::Surface::Surface(&local_1d8);
        tcu::Surface::Surface(&local_1c0);
        this_00 = local_1f0;
        iVar11 = 7;
        if (2 < iVar8 && 2 < iVar4) {
          sglr::ContextWrapper::setContext(local_1f0,&local_1e0->super_Context);
          renderTexCube(this,&local_1c0,iVar9,height,face);
          sglr::ContextWrapper::setContext(this_00,&local_1e8->super_Context);
          renderTexCube(this,&local_1d8,iVar9,height,face);
          log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          local_218 = local_208;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_218,"Image comparison result: ","");
          std::__cxx11::ostringstream::ostringstream(local_1a8);
          tcu::operator<<((ostream *)local_1a8,face);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream(local_1a8);
          std::ios_base::~ios_base(local_138);
          uVar10 = 0xf;
          if (local_218 != local_208) {
            uVar10 = local_208[0];
          }
          if (uVar10 < (ulong)(local_230 + local_210)) {
            uVar10 = 0xf;
            if (local_238 != local_228) {
              uVar10 = local_228[0];
            }
            if (uVar10 < (ulong)(local_230 + local_210)) goto LAB_003501b3;
            puVar5 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_238,0,(char *)0x0,(ulong)local_218)
            ;
          }
          else {
LAB_003501b3:
            puVar5 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_218,(ulong)local_238);
          }
          local_260 = &local_250;
          plVar1 = puVar5 + 2;
          if ((long *)*puVar5 == plVar1) {
            local_250 = *plVar1;
            uStack_248 = puVar5[3];
          }
          else {
            local_250 = *plVar1;
            local_260 = (long *)*puVar5;
          }
          *puVar5 = plVar1;
          puVar5[1] = 0;
          *(undefined1 *)plVar1 = 0;
          bVar2 = tcu::fuzzyCompare(log,"Result",(char *)local_260,&local_1d8,&local_1c0,0.02,
                                    local_23c);
          if (local_260 != &local_250) {
            operator_delete(local_260,local_250 + 1);
          }
          if (local_238 != local_228) {
            operator_delete(local_238,local_228[0] + 1);
          }
          if (local_218 != local_208) {
            operator_delete(local_218,local_208[0] + 1);
          }
          iVar11 = 0;
          if (!bVar2) {
            iVar11 = 5;
            tcu::TestContext::setTestResult
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                       QP_TEST_RESULT_FAIL,"Image comparison failed");
          }
        }
        tcu::Surface::~Surface(&local_1c0);
        tcu::Surface::~Surface(&local_1d8);
      } while (((iVar11 == 7) || (iVar11 == 0)) &&
              (face = face + CUBEFACE_POSITIVE_X, face != CUBEFACE_LAST));
    } while ((bVar2 != false) &&
            (uVar6 = (int)local_1f8 + 1, local_1f8 = (ulong)uVar6, uVar6 != local_240));
  }
  return;
}

Assistant:

void TextureSpecCase::verifyTexCube (sglr::GLContext& gles2Context, sglr::ReferenceContext& refContext)
{
	int numLevels = (m_flags & MIPMAPS) ? de::max(deLog2Floor32(m_width), deLog2Floor32(m_height))+1 : 1;

	DE_ASSERT(m_texType == TEXTURETYPE_CUBE);

	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		int		levelW	= de::max(1, m_width >> levelNdx);
		int		levelH	= de::max(1, m_height >> levelNdx);
		bool	isOk	= true;

		for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
		{
			tcu::Surface	reference;
			tcu::Surface	result;

			if (levelW <= 2 || levelH <= 2)
				continue; // Don't bother checking.

			// Render with GLES2
			setContext(&gles2Context);
			renderTexCube(result, levelW, levelH, (tcu::CubeFace)face);

			// Render reference.
			setContext(&refContext);
			renderTexCube(reference, levelW, levelH, (tcu::CubeFace)face);

			const float	threshold	= 0.02f;
			isOk = tcu::fuzzyCompare(m_testCtx.getLog(), "Result", (string("Image comparison result: ") + de::toString((tcu::CubeFace)face)).c_str(), reference, result, threshold,
									 levelNdx == 0 ? tcu::COMPARE_LOG_RESULT : tcu::COMPARE_LOG_ON_ERROR);

			if (!isOk)
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
				break;
			}
		}

		if (!isOk)
			break;
	}
}